

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void delay(uint ms)

{
  sleep(ms / 1000);
  usleep((ms % 1000) * 1000);
  return;
}

Assistant:

inline void
delay(unsigned int ms)
{
#if defined(_WIN32)
  Sleep(ms);
#else
  sleep(ms / 1000);
  usleep(ms % 1000 * 1000);
#endif
}